

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexArrayTest.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::MultiVertexArrayStorageTests::addStorageCases
          (MultiVertexArrayStorageTests *this,Spec *spec,int depth)

{
  Storage storage_;
  TestContext *testCtx;
  GLValue min_;
  GLValue max_;
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  MultiVertexArrayTest *this_00;
  RenderContext *renderCtx;
  char *name_00;
  char *desc_00;
  GLValue GVar4;
  GLValue GVar5;
  Spec local_130;
  undefined1 local_108 [8];
  Spec _spec;
  undefined4 uStack_cc;
  undefined1 local_c0 [8];
  ArraySpec arraySpec;
  int storageNdx;
  Storage storages [2];
  undefined1 local_68 [8];
  string desc;
  string name;
  int arrayNdx;
  bool ok;
  int depth_local;
  Spec *spec_local;
  MultiVertexArrayStorageTests *this_local;
  
  if (depth == 0) {
    bVar1 = false;
    for (name.field_2._12_4_ = 0;
        sVar2 = std::
                vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                ::size(&spec->arrays), (int)name.field_2._12_4_ < (int)sVar2;
        name.field_2._12_4_ = name.field_2._12_4_ + 1) {
      pvVar3 = std::
               vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
               ::operator[](&spec->arrays,(long)(int)name.field_2._12_4_);
      if (pvVar3->storage != STORAGE_USER) {
        bVar1 = true;
        break;
      }
    }
    if (bVar1) {
      getTestName_abi_cxx11_((string *)((long)&desc.field_2 + 8),this,spec);
      getTestName_abi_cxx11_((string *)local_68,this,spec);
      this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
      testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
      renderCtx = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
      name_00 = (char *)std::__cxx11::string::c_str();
      desc_00 = (char *)std::__cxx11::string::c_str();
      deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                (this_00,testCtx,renderCtx,spec,name_00,desc_00);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
      std::__cxx11::string::~string((string *)local_68);
      std::__cxx11::string::~string((string *)(desc.field_2._M_local_buf + 8));
    }
  }
  else {
    stack0xffffffffffffff84 = 0x100000000;
    for (arraySpec.max.field_1.fl.m_value = (Float)0.0; (int)arraySpec.max.field_1.fl.m_value < 2;
        arraySpec.max.field_1.fl.m_value = (Float)((int)arraySpec.max.field_1.fl.m_value + 1)) {
      storage_ = *(Storage *)
                  ((long)&arraySpec.max.field_1 +
                  (long)(int)arraySpec.max.field_1.fl.m_value * 4 + 4);
      GVar4 = deqp::gls::GLValue::getMinValue(INPUTTYPE_FLOAT);
      GVar5 = deqp::gls::GLValue::getMaxValue(INPUTTYPE_FLOAT);
      _spec.arrays.
      super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = GVar5.type;
      max_._4_4_ = _spec.arrays.
                   super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      max_.type = (InputType)
                  _spec.arrays.
                  super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      min_._4_4_ = uStack_cc;
      min_.type = GVar4.type;
      min_.field_1 = GVar4.field_1;
      max_.field_1 = GVar5.field_1;
      deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                ((ArraySpec *)local_c0,INPUTTYPE_FLOAT,OUTPUTTYPE_VEC2,storage_,USAGE_DYNAMIC_DRAW,2
                 ,0,0,false,min_,max_);
      deqp::gls::MultiVertexArrayTest::Spec::Spec((Spec *)local_108,spec);
      std::
      vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
      ::push_back((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                   *)&_spec.first,(ArraySpec *)local_c0);
      deqp::gls::MultiVertexArrayTest::Spec::Spec(&local_130,(Spec *)local_108);
      addStorageCases(this,&local_130,depth + -1);
      deqp::gls::MultiVertexArrayTest::Spec::~Spec(&local_130);
      deqp::gls::MultiVertexArrayTest::Spec::~Spec((Spec *)local_108);
    }
  }
  return;
}

Assistant:

void MultiVertexArrayStorageTests::addStorageCases (MultiVertexArrayTest::Spec spec, int depth)
{
	if (depth == 0)
	{
		// Skip trivial case, used elsewhere
		bool ok = false;
		for (int arrayNdx = 0; arrayNdx < (int)spec.arrays.size(); arrayNdx++)
		{
			if (spec.arrays[arrayNdx].storage != Array::STORAGE_USER)
			{
				ok = true;
				break;
			}
		}

		if (!ok)
			return;

		std::string name = getTestName(spec);
		std::string desc = getTestName(spec);

		addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), desc.c_str()));
		return;
	}

	Array::Storage storages[] = {Array::STORAGE_USER, Array::STORAGE_BUFFER};
	for (int storageNdx = 0; storageNdx < DE_LENGTH_OF_ARRAY(storages); storageNdx++)
	{
		MultiVertexArrayTest::Spec::ArraySpec arraySpec(Array::INPUTTYPE_FLOAT,
														Array::OUTPUTTYPE_VEC2,
														storages[storageNdx],
														Array::USAGE_DYNAMIC_DRAW,
														2,
														0,
														0,
														false,
														GLValue::getMinValue(Array::INPUTTYPE_FLOAT),
														GLValue::getMaxValue(Array::INPUTTYPE_FLOAT));

		MultiVertexArrayTest::Spec _spec = spec;
		_spec.arrays.push_back(arraySpec);
		addStorageCases(_spec, depth-1);
	}
}